

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

DecodeUnlockingScriptStruct * __thiscall
cfd::api::json::DecodeUnlockingScript::ConvertToStruct(DecodeUnlockingScript *this)

{
  DecodeUnlockingScriptStruct *in_RSI;
  DecodeUnlockingScriptStruct *in_RDI;
  DecodeUnlockingScriptStruct *result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  DecodeUnlockingScriptStruct *this_00;
  
  this_00 = in_RDI;
  DecodeUnlockingScriptStruct::DecodeUnlockingScriptStruct(in_RSI);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&in_RSI->field_0x38);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->hex,
             (string *)&(in_RSI->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
  ;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,in_stack_ffffffffffffffb8);
  return this_00;
}

Assistant:

DecodeUnlockingScriptStruct DecodeUnlockingScript::ConvertToStruct() const {  // NOLINT
  DecodeUnlockingScriptStruct result;
  result.asm_ = asm__;
  result.hex = hex_;
  result.ignore_items = ignore_items;
  return result;
}